

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O1

string * pstore::brokerface::fifo_path::get_default_path_abi_cxx11_(void)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string *in_RDI;
  long *local_30;
  undefined8 local_28;
  long local_20;
  undefined2 local_18;
  
  local_20 = 0x706d742f7261762f;
  local_18 = 0x2f;
  local_28 = 9;
  local_30 = &local_20;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar3;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30 != &local_20) {
    operator_delete(local_30,local_20 + 1);
  }
  return in_RDI;
}

Assistant:

std::string fifo_path::get_default_path () {
            // TODO: consider using /run/user/<userid> on Linux?
            return "/var/tmp/"s + default_pipe_name;
        }